

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O0

void __thiscall draco::EncoderOptionsBase<int>::~EncoderOptionsBase(EncoderOptionsBase<int> *this)

{
  DracoOptions<int> *in_RDI;
  
  Options::~Options((Options *)0x112eec);
  DracoOptions<int>::~DracoOptions(in_RDI);
  return;
}

Assistant:

static EncoderOptionsBase CreateDefaultOptions() {
    EncoderOptionsBase options;
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kEdgebreaker, true);
#endif
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kPredictiveEdgebreaker, true);
#endif
    return options;
  }